

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O0

unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
 __thiscall
pstore::index::details::linear_node::allocate_from
          (linear_node *this,database *db,index_pointer node,size_t extra_children)

{
  undefined1 local_40 [8];
  pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
  p;
  size_t extra_children_local;
  database *db_local;
  index_pointer node_local;
  
  p.second = (linear_node *)extra_children;
  get_node((pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
            *)local_40,db,node);
  if (p.first.
      super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    allocate_from(this,(linear_node *)
                       p.first.
                       super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi,(size_t)p.second);
    std::
    pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
    ::~pair((pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
             *)local_40);
    return (__uniq_ptr_data<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>,_true,_true>
            )(__uniq_ptr_data<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>,_true,_true>
              )this;
  }
  assert_failed("p.second != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                ,0x72);
}

Assistant:

std::unique_ptr<linear_node>
            linear_node::allocate_from (database const & db, index_pointer const node,
                                        std::size_t const extra_children) {
                std::pair<std::shared_ptr<linear_node const>, linear_node const *> const p =
                    linear_node::get_node (db, node);
                PSTORE_ASSERT (p.second != nullptr);
                return linear_node::allocate_from (*p.second, extra_children);
            }